

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image-write.h
# Opt level: O3

void stbiw__encode_png_line
               (uchar *pixels,int stride_bytes,int width,int height,int y,int n,int filter_type,
               char *line_buffer)

{
  uchar *__src;
  byte bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  int iVar11;
  undefined4 in_register_0000008c;
  uchar uVar12;
  int *piVar13;
  uint uVar14;
  
  piVar13 = stbiw__encode_png_line::mapping;
  if (height == 0) {
    piVar13 = stbiw__encode_png_line::firstmap;
  }
  __src = pixels + height * stride_bytes;
  if (piVar13[y] == 0) {
    memcpy((void *)CONCAT44(in_register_0000008c,n),__src,(long)(width << 2));
    return;
  }
  lVar5 = (long)(height * stride_bytes) - (long)stride_bytes;
  lVar3 = 0;
  iVar11 = piVar13[y] + -1;
  do {
    switch(iVar11) {
    case 0:
    case 4:
    case 5:
      uVar12 = __src[lVar3];
      break;
    case 1:
    case 3:
      uVar12 = __src[lVar3] - pixels[lVar3 + lVar5];
      break;
    case 2:
      uVar12 = __src[lVar3] - (pixels[lVar3 + lVar5] >> 1);
      break;
    default:
      goto switchD_001398a0_default;
    }
    *(uchar *)(CONCAT44(in_register_0000008c,n) + lVar3) = uVar12;
switchD_001398a0_default:
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      switch(iVar11) {
      case 0:
        if (1 < width) {
          uVar4 = 5;
          if (5 < width * 4) {
            uVar4 = (ulong)(uint)(width * 4);
          }
          uVar6 = 4;
          do {
            *(uchar *)(CONCAT44(in_register_0000008c,n) + uVar6) = __src[uVar6] - __src[uVar6 - 4];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        break;
      case 1:
        if (1 < width) {
          uVar4 = 5;
          if (5 < width * 4) {
            uVar4 = (ulong)(uint)(width * 4);
          }
          uVar6 = 4;
          do {
            *(uchar *)(CONCAT44(in_register_0000008c,n) + uVar6) =
                 __src[uVar6] - pixels[uVar6 + lVar5];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        break;
      case 2:
        if (1 < width) {
          uVar4 = 5;
          if (5 < width * 4) {
            uVar4 = (ulong)(uint)(width * 4);
          }
          uVar6 = 4;
          do {
            *(uchar *)(CONCAT44(in_register_0000008c,n) + uVar6) =
                 __src[uVar6] - (char)((uint)pixels[uVar6 + lVar5] + (uint)__src[uVar6 - 4] >> 1);
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        break;
      case 3:
        if (1 < width) {
          uVar4 = 5;
          if (5 < width * 4) {
            uVar4 = (ulong)(uint)(width * 4);
          }
          uVar6 = 4;
          do {
            bVar7 = __src[uVar6 - 4];
            bVar1 = pixels[uVar6 + lVar5];
            bVar10 = pixels[uVar6 + lVar5 + -4];
            iVar11 = ((uint)bVar1 + (uint)bVar7) - (uint)bVar10;
            uVar8 = iVar11 - (uint)bVar7;
            uVar2 = -uVar8;
            if (0 < (int)uVar8) {
              uVar2 = uVar8;
            }
            uVar9 = iVar11 - (uint)bVar1;
            uVar8 = -uVar9;
            if (0 < (int)uVar9) {
              uVar8 = uVar9;
            }
            uVar14 = iVar11 - (uint)bVar10;
            uVar9 = -uVar14;
            if (0 < (int)uVar14) {
              uVar9 = uVar14;
            }
            if (uVar8 <= uVar9) {
              bVar10 = bVar1;
            }
            if (uVar9 < uVar2) {
              bVar7 = bVar10;
            }
            if (uVar8 < uVar2) {
              bVar7 = bVar10;
            }
            *(byte *)(CONCAT44(in_register_0000008c,n) + uVar6) = __src[uVar6] - bVar7;
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        break;
      case 4:
        if (1 < width) {
          uVar4 = 5;
          if (5 < width * 4) {
            uVar4 = (ulong)(uint)(width * 4);
          }
          uVar6 = 4;
          do {
            *(uchar *)(CONCAT44(in_register_0000008c,n) + uVar6) =
                 __src[uVar6] - (__src[uVar6 - 4] >> 1);
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        break;
      case 5:
        if (1 < width) {
          uVar4 = 5;
          if (5 < width * 4) {
            uVar4 = (ulong)(uint)(width * 4);
          }
          uVar6 = 4;
          do {
            *(uchar *)(CONCAT44(in_register_0000008c,n) + uVar6) = __src[uVar6] - __src[uVar6 - 4];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

static void stbiw__encode_png_line(unsigned char *pixels, int stride_bytes, int width, int height, int y, int n, int filter_type, signed char *line_buffer)
{
   static int mapping[] = { 0,1,2,3,4 };
   static int firstmap[] = { 0,1,0,5,6 };
   int *mymap = (y != 0) ? mapping : firstmap;
   int i;
   int type = mymap[filter_type];
   unsigned char *z = pixels + stride_bytes * (stbi__flip_vertically_on_write ? height-1-y : y);
   int signed_stride = stbi__flip_vertically_on_write ? -stride_bytes : stride_bytes;

   if (type==0) {
      memcpy(line_buffer, z, width*n);
      return;
   }

   // first loop isn't optimized since it's just one pixel
   for (i = 0; i < n; ++i) {
      switch (type) {
         case 1: line_buffer[i] = z[i]; break;
         case 2: line_buffer[i] = z[i] - z[i-signed_stride]; break;
         case 3: line_buffer[i] = z[i] - (z[i-signed_stride]>>1); break;
         case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-signed_stride],0)); break;
         case 5: line_buffer[i] = z[i]; break;
         case 6: line_buffer[i] = z[i]; break;
      }
   }
   switch (type) {
      case 1: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-n]; break;
      case 2: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-signed_stride]; break;
      case 3: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - ((z[i-n] + z[i-signed_stride])>>1); break;
      case 4: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-signed_stride], z[i-signed_stride-n]); break;
      case 5: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - (z[i-n]>>1); break;
      case 6: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
   }
}